

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

char * assignGapColorForKin(float gap,int class)

{
  char *local_18;
  char *colorValue;
  int class_local;
  float gap_local;
  
  if (class == 6) {
    local_18 = "greentint ";
  }
  else if (gap <= 0.35) {
    if (gap <= 0.25) {
      if (gap <= 0.15) {
        if (gap <= 0.0) {
          if (gap <= -0.1) {
            if (gap <= -0.2) {
              if (gap <= -0.3) {
                if (gap <= -0.4) {
                  local_18 = "hotpink ";
                }
                else {
                  local_18 = "red ";
                }
              }
              else {
                local_18 = "orange ";
              }
            }
            else {
              local_18 = "yellow ";
            }
          }
          else {
            local_18 = "yellowtint ";
          }
        }
        else {
          local_18 = "green ";
        }
      }
      else {
        local_18 = "sea ";
      }
    }
    else {
      local_18 = "sky ";
    }
  }
  else {
    local_18 = "blue ";
  }
  return local_18;
}

Assistant:

char* assignGapColorForKin(float gap, int class)
{
   char *colorValue = "";
   //if (class == 4)     { colorValue = "greentint "; } /* hbond */ /* 04/16/2015 SJ changed 4 to 6, as H-bond are now 6 in NODEWIDTH, see probe.h*/
   if (class == 6)     { colorValue = "greentint "; }
   else if (gap > 0.35){ colorValue = "blue ";      }
   else if (gap > 0.25){ colorValue = "sky ";       }
   else if (gap > 0.15){ colorValue = "sea ";       }
   else if (gap > 0.0) { colorValue = "green ";     }
   else if (gap >-0.1) { colorValue = "yellowtint ";}
   else if (gap >-0.2) { colorValue = "yellow ";    }
   else if (gap >-0.3) { colorValue = "orange ";    }
   else if (gap >-0.4) { colorValue = "red ";       }
   else                { colorValue = "hotpink ";   }
   return colorValue;
}